

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O1

void emit_varname_or_constant(Function *fn,Pseudo *pseudo)

{
  Constant *pCVar1;
  uint uVar2;
  ravitype_t rVar3;
  char *pcVar4;
  
  uVar2 = *(uint *)pseudo & 0xf;
  if (uVar2 - 1 < 3) {
    emit_varname(fn,pseudo);
    return;
  }
  if (uVar2 == 0) {
    rVar3 = RAVI_TANY;
    if (((pseudo->field_3).symbol)->symbol_type < SYM_GLOBAL) {
      rVar3 = (((pseudo->field_3).symbol)->field_1).variable.value_type.type_code;
    }
    if (rVar3 == RAVI_TNUMINT) {
      pcVar4 = "ivalue(";
LAB_00122880:
      raviX_buffer_add_string(&fn->body,pcVar4);
      emit_reg_accessor(fn,pseudo,0);
      raviX_buffer_add_string(&fn->body,")");
      return;
    }
    if (rVar3 == RAVI_TNUMFLT) {
      pcVar4 = "fltvalue(";
      goto LAB_00122880;
    }
  }
  else if (uVar2 == 5) {
    pCVar1 = (pseudo->field_3).constant;
    if (pCVar1->type == 0x10) {
      raviX_buffer_add_double(&fn->body,(pCVar1->field_2).n);
      return;
    }
    if (pCVar1->type == 8) {
      raviX_buffer_add_fstring(&fn->body,"%lld",(pCVar1->field_2).i);
      return;
    }
    pcVar4 = "emit_varname_or_constant: Unexpected pseudo type";
    goto LAB_001228cf;
  }
  pcVar4 = "emit_varname_or_constant: Unexpected pseudo";
LAB_001228cf:
  handle_error_bad_pseudo(fn,pseudo,pcVar4);
}

Assistant:

static void emit_varname_or_constant(Function *fn, Pseudo *pseudo)
{
	if (pseudo->type == PSEUDO_CONSTANT) {
		if (pseudo->constant->type == RAVI_TNUMINT) {
			raviX_buffer_add_fstring(&fn->body, "%lld", pseudo->constant->i);
		} else if (pseudo->constant->type == RAVI_TNUMFLT) {
			raviX_buffer_add_double(&fn->body, pseudo->constant->n);
		} else {
			handle_error_bad_pseudo(fn, pseudo, "emit_varname_or_constant: Unexpected pseudo type");
		}
	} else if (pseudo->type == PSEUDO_TEMP_INT || pseudo->type == PSEUDO_TEMP_BOOL ||
		   pseudo->type == PSEUDO_TEMP_FLT) {
		emit_varname(fn, pseudo);
	} else if (pseudo->type == PSEUDO_SYMBOL) {
		ravitype_t typecode = RAVI_TANY;
		if (pseudo->symbol->symbol_type == SYM_LOCAL) {
			typecode = pseudo->symbol->variable.value_type.type_code;
		} else if (pseudo->symbol->symbol_type == SYM_UPVALUE) {
			typecode = pseudo->symbol->upvalue.value_type.type_code;
		}
		if (typecode == RAVI_TNUMFLT) {
			raviX_buffer_add_string(&fn->body, "fltvalue(");
			emit_reg_accessor(fn, pseudo, 0); // discriminator not used
			raviX_buffer_add_string(&fn->body, ")");
		} else if (typecode == RAVI_TNUMINT) {
			raviX_buffer_add_string(&fn->body, "ivalue(");
			emit_reg_accessor(fn, pseudo, 0); // discriminator not used
			raviX_buffer_add_string(&fn->body, ")");
		} else {
			handle_error_bad_pseudo(fn, pseudo, "emit_varname_or_constant: Unexpected pseudo");
		}
	} else {
		handle_error_bad_pseudo(fn, pseudo, "emit_varname_or_constant: Unexpected pseudo");
	}
}